

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O3

void mapAddIsland(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int64_t chunkZ;
  
  (*l->p->getMap)(l->p,out,(long)((int)areaX + -1),(long)((int)areaZ + -1),areaWidth + 2U,
                  areaHeight + 2);
  if (0 < areaHeight) {
    lVar5 = l->worldSeed;
    lVar10 = (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar5;
    lVar13 = (ulong)(areaWidth + 2U) * 4;
    lVar1 = areaX + lVar10;
    uVar11 = 0;
    do {
      if (0 < areaWidth) {
        lVar7 = areaZ + uVar11;
        lVar14 = (uVar11 + 2) * lVar13;
        uVar17 = 0;
        lVar16 = areaX * 0x5851f42d4c957f2d + 0x14057b7ef767814f + lVar10 * 0x5851f42d4c957f2d;
        do {
          iVar15 = *(int *)((long)out + uVar17 * 4 + lVar13 * uVar11);
          iVar2 = *(int *)((long)out + uVar17 * 4 + lVar13 * uVar11 + 8);
          iVar3 = *(int *)((long)out + uVar17 * 4 + lVar14);
          iVar4 = *(int *)((long)out + uVar17 * 4 + lVar14 + 8);
          iVar6 = *(int *)((long)out + uVar17 * 4 + lVar13 * (uVar11 + 1) + 4);
          if (iVar6 == 0) {
            if ((((iVar15 != 0) || (iVar2 != 0)) || (iVar3 != 0)) || (iVar4 != 0)) {
              lVar12 = (lVar1 + uVar17) * lVar16 + lVar7;
              lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + areaX + uVar17;
              uVar8 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar7;
              if (iVar15 == 0) {
                iVar6 = 1;
              }
              else {
                uVar8 = (uVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar8 + lVar5;
                iVar6 = iVar15;
              }
              cVar9 = iVar15 != 0;
              if (iVar2 != 0) {
                cVar9 = cVar9 + '\x01';
                if ((uVar8 & 0x1000000) == 0) {
                  iVar6 = iVar2;
                }
                if (iVar15 == 0) {
                  iVar6 = iVar2;
                }
                uVar8 = (uVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar8 + lVar5;
              }
              iVar15 = iVar6;
              if (iVar3 != 0) {
                iVar15 = iVar3;
                if (cVar9 != '\0') {
                  if (cVar9 == '\x01') {
                    if (((uint)uVar8 >> 0x18 & 1) != 0) {
                      iVar15 = iVar6;
                    }
                  }
                  else if (0x5555555555555554 <
                           ((long)uVar8 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU) {
                    iVar15 = iVar6;
                  }
                }
                cVar9 = cVar9 + '\x01';
                uVar8 = (uVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar8 + lVar5;
              }
              iVar6 = iVar15;
              if (iVar4 != 0) {
                iVar6 = iVar4;
                if (cVar9 != '\0') {
                  if (cVar9 == '\x02') {
                    if (0x5555555555555554 <
                        ((long)uVar8 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU) {
                      iVar6 = iVar15;
                    }
                  }
                  else if (cVar9 == '\x01') {
                    if (((uint)uVar8 >> 0x18 & 1) != 0) {
                      iVar6 = iVar15;
                    }
                  }
                  else if ((uVar8 & 0x3000000) != 0) {
                    iVar6 = iVar15;
                  }
                }
                uVar8 = (uVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar8 + lVar5;
              }
              if (0x5555555555555554 <
                  ((long)uVar8 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU) {
                iVar6 = (uint)(iVar6 == 4) << 2;
              }
            }
          }
          else if ((0 < iVar6) &&
                  ((((iVar15 == 0 || (iVar2 == 0)) || ((iVar3 == 0 || (iVar4 == 0)))) &&
                   (lVar12 = (lVar1 + uVar17) * lVar16 + lVar7,
                   lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 +
                            areaX + uVar17,
                   ((lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar7 >> 0x18) *
                   -0x3333333333333333 + 0x1999999999999999U < 0x3333333333333333)))) {
            iVar6 = (uint)(iVar6 == 4) << 2;
          }
          out[uVar11 * (uint)areaWidth + uVar17] = iVar6;
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 0x5851f42d4c957f2d;
        } while ((uint)areaWidth != uVar17);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)areaHeight);
  }
  return;
}

Assistant:

void mapAddIsland(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    int pX = (int)areaX - 1;
    int pZ = (int)areaZ - 1;
    int pWidth = areaWidth + 2;
    int pHeight = areaHeight + 2;
    int x, z;

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    const int64_t ws = l->worldSeed;
    const int64_t ss = ws * (ws * 6364136223846793005LL + 1442695040888963407LL);

    for (z = 0; z < areaHeight; z++) {
        for (x = 0; x < areaWidth; x++) {
            int v00 = out[x + 0 + (z + 0) * pWidth];
            int v20 = out[x + 2 + (z + 0) * pWidth];
            int v02 = out[x + 0 + (z + 2) * pWidth];
            int v22 = out[x + 2 + (z + 2) * pWidth];
            int v11 = out[x + 1 + (z + 1) * pWidth];

            if (v11 == 0 && (v00 != 0 || v20 != 0 || v02 != 0 || v22 != 0)) {
                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);
                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                int v = 1;
                int inc = 0;

                if (v00 != 0) {
                    ++inc;
                    v = v00;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v20 != 0) {
                    if (++inc == 1 || (cs & (1LL << 24)) == 0) v = v20;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v02 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v02;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v02;
                            break;
                        default:
                            if (((cs >> 24) % 3) == 0) v = v02;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v22 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v22;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v22;
                            break;
                        case 3:
                            if (((cs >> 24) % 3) == 0) v = v22;
                            break;
                        default:
                            if ((cs & (3LL << 24)) == 0) v = v22;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }

                if ((cs >> 24) % 3 == 0)
                    out[x + z * areaWidth] = v;
                else if (v == 4)
                    out[x + z * areaWidth] = 4;
                else
                    out[x + z * areaWidth] = 0;
            } else if (v11 > 0 && (v00 == 0 || v20 == 0 || v02 == 0 || v22 == 0)) {
                //setChunkSeed(l, (int64_t)(x + areaX), (int64_t)(z + areaZ));
                //if (mcNextInt(l, 5) == 0)...

                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);

                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                if ((cs >> 24) % 5 == 0)
                    out[x + z * areaWidth] = (v11 == 4) ? 4 : 0;
                else
                    out[x + z * areaWidth] = v11;
            } else {
                out[x + z * areaWidth] = v11;
            }
        }
    }
}